

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.h
# Opt level: O0

bool __thiscall
draco::MeshAttributeCornerTable::IsOnBoundary(MeshAttributeCornerTable *this,VertexIndex vert)

{
  bool bVar1;
  CornerIndex CVar2;
  undefined4 in_ESI;
  MeshAttributeCornerTable *in_RDI;
  CornerIndex corner;
  VertexIndex in_stack_ffffffffffffffe0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_1c;
  CornerIndex corner_00;
  bool local_1;
  
  CVar2 = LeftMostCorner(in_RDI,in_stack_ffffffffffffffe0);
  corner_00.value_ = (uint)in_RDI;
  bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                    ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                     &stack0xffffffffffffffec,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex);
  if (bVar1) {
    local_1 = true;
  }
  else {
    local_1c.value_ =
         (uint)SwingLeft((MeshAttributeCornerTable *)CONCAT44(CVar2.value_,in_ESI),corner_00);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_1c,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool IsOnBoundary(VertexIndex vert) const {
    const CornerIndex corner = LeftMostCorner(vert);
    if (corner == kInvalidCornerIndex) {
      return true;
    }
    if (SwingLeft(corner) == kInvalidCornerIndex) {
      return true;
    }
    return false;
  }